

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O3

Type wasm::TypeUpdating::getValidLocalType(Type type,FeatureSet features)

{
  bool bVar1;
  HeapType heapType;
  Type local_20;
  Type local_18;
  
  local_18.id = type.id;
  bVar1 = canHandleAsLocal(type);
  if (!bVar1) {
    __assert_fail("canHandleAsLocal(type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                  ,0x182,"Type wasm::TypeUpdating::getValidLocalType(Type, FeatureSet)");
  }
  bVar1 = wasm::Type::isNonNullable(&local_18);
  if (bVar1 && (features.features >> 0xc & 1) == 0) {
    heapType = wasm::Type::getHeapType(&local_18);
    wasm::Type::Type(&local_20,heapType,Nullable);
    local_18.id = local_20.id;
  }
  return (Type)local_18.id;
}

Assistant:

Type getValidLocalType(Type type, FeatureSet features) {
  // TODO: this should handle tuples with a non-nullable item
  assert(canHandleAsLocal(type));
  if (type.isNonNullable() && !features.hasGCNNLocals()) {
    type = Type(type.getHeapType(), Nullable);
  }
  return type;
}